

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O1

int BIO_write_all(BIO *bio,void *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  do {
    if (len == 0) {
      return 1;
    }
    uVar3 = 0x7fffffff;
    if (len < 0x7fffffff) {
      uVar3 = len;
    }
    uVar1 = BIO_write((BIO *)bio,data,(int)uVar3);
    uVar2 = uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = 0;
    }
    len = len - uVar2;
    data = (void *)((long)data + (ulong)uVar2);
  } while (0 < (int)uVar1);
  return 0;
}

Assistant:

int BIO_write_all(BIO *bio, const void *data, size_t len) {
  const uint8_t *data_u8 = reinterpret_cast<const uint8_t *>(data);
  while (len > 0) {
    int ret = BIO_write(bio, data_u8, len > INT_MAX ? INT_MAX : (int)len);
    if (ret <= 0) {
      return 0;
    }
    data_u8 += ret;
    len -= ret;
  }
  return 1;
}